

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O2

int Cbs2_ManResolve(Cbs2_Man_t *p,int Level,int hClause0,int hClause1)

{
  Cbs2_Que_t *p_00;
  Vec_Str_t *p_01;
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  piVar4 = (p->pClauses).pData;
  lVar5 = (long)Level;
  iVar3 = piVar4[lVar5 + 1];
  if (iVar3 == 0) {
    __assert_fail("pQue->pData[hClause0+1] != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x39d,"int Cbs2_ManResolve(Cbs2_Man_t *, int, int, int)");
  }
  lVar6 = (long)hClause0;
  if (iVar3 == piVar4[lVar6 + 1]) {
    if ((p->pClauses).iHead == (p->pClauses).iTail) {
      p_00 = &p->pClauses;
      Cbs2_QuePush(p_00,0);
      Cbs2_QuePush(p_00,0);
      p_01 = &p->vMark;
      iVar3 = -1;
      for (lVar7 = 2;
          (piVar4 = (p->pClauses).pData, lVar7 <= piVar4[lVar5] &&
          (iVar2 = piVar4[lVar5 + lVar7], iVar2 != 0)); lVar7 = lVar7 + 1) {
        iVar1 = Cbs2_VarMark0(p,iVar2);
        if (iVar1 == 0) {
          Vec_StrWriteEntry(p_01,iVar2,'\x01');
          Cbs2_QuePush(p_00,iVar2);
          iVar2 = Cbs2_VarDecLevel(p,iVar2);
          if (iVar3 <= iVar2) {
            iVar3 = iVar2;
          }
        }
      }
      lVar5 = 2;
      while ((lVar5 <= piVar4[lVar6] && (iVar2 = piVar4[lVar6 + lVar5], iVar2 != 0))) {
        iVar1 = Cbs2_VarMark0(p,iVar2);
        if (iVar1 == 0) {
          Vec_StrWriteEntry(p_01,iVar2,'\x01');
          Cbs2_QuePush(p_00,iVar2);
          iVar2 = Cbs2_VarDecLevel(p,iVar2);
          if (iVar3 <= iVar2) {
            iVar3 = iVar2;
          }
        }
        lVar5 = lVar5 + 1;
        piVar4 = (p->pClauses).pData;
      }
      for (lVar5 = (long)(p_00->iHead + 2); lVar5 < (p->pClauses).iTail; lVar5 = lVar5 + 1) {
        Vec_StrWriteEntry(p_01,(p->pClauses).pData[lVar5],'\0');
      }
      iVar3 = Cbs2_ManDeriveReason(p,iVar3);
      return iVar3;
    }
    __assert_fail("Cbs2_QueIsEmpty( pQue )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x3a3,"int Cbs2_ManResolve(Cbs2_Man_t *, int, int, int)");
  }
  __assert_fail("pQue->pData[hClause0+1] == pQue->pData[hClause1+1]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                ,0x39e,"int Cbs2_ManResolve(Cbs2_Man_t *, int, int, int)");
}

Assistant:

static inline int Cbs2_ManResolve( Cbs2_Man_t * p, int Level, int hClause0, int hClause1 )
{
    Cbs2_Que_t * pQue = &(p->pClauses);
    int i, iObj, LevelMax = -1, LevelCur;
    assert( pQue->pData[hClause0+1] != 0 );
    assert( pQue->pData[hClause0+1] == pQue->pData[hClause1+1] );
    //Cbs2_ClauseForEachEntry1( p, hClause0, iObj, i )
    //    assert( !Cbs2_VarMark0(p, iObj) );
    //Cbs2_ClauseForEachEntry1( p, hClause1, iObj, i )
    //    assert( !Cbs2_VarMark0(p, iObj) );
    assert( Cbs2_QueIsEmpty( pQue ) );
    Cbs2_QuePush( pQue, 0 );
    Cbs2_QuePush( pQue, 0 );
//    for ( i = hClause0 + 1; (iObj = pQue->pData[i]); i++ )
    Cbs2_ClauseForEachEntry1( p, hClause0, iObj, i )
    {
        if ( Cbs2_VarMark0(p, iObj) ) // unassigned - seen again
            continue;
        //if ( Vec_IntEntry(&p->vActivity, iObj) == 0 )
        //    Vec_IntPush( &p->vActStore, iObj );
        //Vec_IntAddToEntry( &p->vActivity, iObj, 1 );
        // assigned - seen first time
        Cbs2_VarSetMark0(p, iObj, 1);
        Cbs2_QuePush( pQue, iObj );
        LevelCur = Cbs2_VarDecLevel( p, iObj );
        if ( LevelMax < LevelCur )
            LevelMax = LevelCur;
    }
//    for ( i = hClause1 + 1; (iObj = pQue->pData[i]); i++ )
    Cbs2_ClauseForEachEntry1( p, hClause1, iObj, i )
    {
        if ( Cbs2_VarMark0(p, iObj) ) // unassigned - seen again
            continue;
        //if ( Vec_IntEntry(&p->vActivity, iObj) == 0 )
        //    Vec_IntPush( &p->vActStore, iObj );
        //Vec_IntAddToEntry( &p->vActivity, iObj, 1 );
        // assigned - seen first time
        Cbs2_VarSetMark0(p, iObj, 1);
        Cbs2_QuePush( pQue, iObj );
        LevelCur = Cbs2_VarDecLevel( p, iObj );
        if ( LevelMax < LevelCur )
            LevelMax = LevelCur;
    }
    for ( i = pQue->iHead + 2; i < pQue->iTail; i++ )
        Cbs2_VarSetMark0(p, pQue->pData[i], 0);
    return Cbs2_ManDeriveReason( p, LevelMax );
}